

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

Loader * __thiscall Loader::fileToBinStr(Loader *this,string *file)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  streamoff sVar3;
  ostream *poVar4;
  string *in_RDX;
  uint local_3e4;
  fpos afStack_3e0 [4];
  int i;
  undefined8 local_3d8;
  uint local_3cc;
  void *pvStack_3c8;
  uint byteCount;
  char *buffer;
  stringstream local_3b0 [8];
  stringstream hexString;
  undefined1 local_3a0 [376];
  char local_228 [8];
  ifstream binFile;
  string *file_local;
  Loader *this_local;
  
  std::ifstream::ifstream(local_228,in_RDX,_S_in);
  std::__cxx11::stringstream::stringstream(local_3b0);
  std::istream::seekg((long)local_228,_S_beg);
  _afStack_3e0 = std::istream::tellg();
  sVar3 = std::fpos::operator_cast_to_long(afStack_3e0);
  local_3cc = (uint)sVar3;
  std::istream::seekg((long)local_228,_S_beg);
  pvStack_3c8 = operator_new__((ulong)local_3cc);
  std::istream::read(local_228,(long)pvStack_3c8);
  std::ifstream::close();
  local_3e4 = local_3cc;
  while (local_3e4 = local_3e4 - 1, -1 < (int)local_3e4) {
    _Var1 = std::setfill<char>('0');
    poVar4 = std::operator<<(local_3a0,_Var1._M_c);
    _Var2 = std::setw(2);
    poVar4 = std::operator<<(poVar4,_Var2);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
    std::ostream::operator<<(poVar4,(uint)*(byte *)((long)pvStack_3c8 + (long)(int)local_3e4));
  }
  if (pvStack_3c8 != (void *)0x0) {
    operator_delete(pvStack_3c8,1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_3b0);
  std::ifstream::~ifstream(local_228);
  return this;
}

Assistant:

string Loader::fileToBinStr(string file) {
	ifstream binFile(file);
	stringstream hexString;

	char *buffer;
	binFile.seekg(0, ios::end);
	unsigned int byteCount = binFile.tellg();
	binFile.seekg(0, ios::beg);
	buffer = new char[byteCount];
	binFile.read(buffer, byteCount);
	binFile.close();

	for (int i = byteCount - 1; i >= 0; i--) {
		hexString << setfill('0') << setw(2) << std::hex
				<< (int) ((unsigned char) buffer[i]);
	}

	delete buffer;

	return hexString.str();
}